

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

double __thiscall
ParserProbModelXML::GetPotential
          (ParserProbModelXML *this,string *var_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps,bool isUtility)

{
  undefined4 uVar1;
  xmlNodeSetPtr pxVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  __type_conflict _Var5;
  ostream *poVar6;
  xmlXPathObjectPtr pxVar7;
  const_iterator cVar8;
  xmlNodePtr pxVar9;
  EParse *pEVar10;
  char *pcVar11;
  ParserProbModelXML *this_00;
  int i;
  long lVar12;
  xmlNodePtr pxVar13;
  undefined1 auVar14 [64];
  double local_338;
  string CPD_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_248;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_1e8;
  stringstream xpath_ss;
  ostream local_1a8 [376];
  undefined1 extraout_var [56];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&xpath_ss);
  std::operator<<(local_1a8,"/ProbModelXML/ProbNet/Potentials/Potential");
  if (isUtility) {
    poVar6 = std::operator<<(local_1a8,"[@role=\'utility\']/UtilityVariable[starts-with(@name, \"");
    poVar6 = std::operator<<(poVar6,(string *)var_name);
    pcVar11 = "\")]/following-sibling::Variables/Variable";
  }
  else {
    poVar6 = std::operator<<(local_1a8,
                             "[@role=\'conditionalProbability\']/Variables/Variable[@timeSlice=\'1\' and contains(@name, \""
                            );
    poVar6 = std::operator<<(poVar6,(string *)var_name);
    pcVar11 = "\")]";
  }
  std::operator<<(poVar6,pcVar11);
  std::__cxx11::stringbuf::str();
  pxVar7 = GetNodesMatchingExpression(this,(xmlChar *)CPD_type._M_dataplus._M_p,(xmlNodePtr)0x0);
  std::__cxx11::string::~string((string *)&CPD_type);
  if (pxVar7 != (xmlXPathObjectPtr)0x0) {
    pxVar2 = pxVar7->nodesetval;
    pxVar13 = *pxVar2->nodeTab;
    if (!isUtility) {
      lVar12 = 0;
      _Var5 = false;
      this_00 = (ParserProbModelXML *)CPD_type._M_dataplus._M_p;
      while (_Var5 == false) {
        if (pxVar2->nodeNr <= lVar12) {
          pEVar10 = (EParse *)__cxa_allocate_exception(0x28);
          std::operator+(&CPD_type,"Could not find CPD for variable ",var_name);
          std::operator+(&local_2b8,&CPD_type,"(empty potential)");
          EParse::EParse(pEVar10,&local_2b8);
          __cxa_throw(pEVar10,&EParse::typeinfo,E::~E);
        }
        pxVar13 = pxVar2->nodeTab[lVar12];
        pxVar9 = (xmlNodePtr)xmlFirstElementChild(pxVar13->parent);
        if (pxVar13 == pxVar9) {
          GetVariableName_abi_cxx11_(&CPD_type,this_00,pxVar13);
          this_00 = (ParserProbModelXML *)var_name;
          _Var5 = std::operator==(&CPD_type,var_name);
          std::__cxx11::string::~string((string *)&CPD_type);
        }
        else {
          _Var5 = false;
        }
        lVar12 = lVar12 + 1;
      }
    }
    pxVar13 = pxVar13->parent->parent;
    pcVar11 = (char *)xmlGetProp(pxVar13,"type");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&CPD_type,pcVar11,(allocator<char> *)&local_2f8);
    bVar4 = std::operator==(&CPD_type,"Uniform");
    if (bVar4) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::find(&t1_deps->_M_t,var_name);
      uVar1 = *(undefined4 *)&cVar8._M_node[2].field_0x4;
      auVar14._0_8_ = xmlXPathFreeObject(pxVar7);
      auVar14._8_56_ = extraout_var;
      auVar3 = vcvtusi2sd_avx512f(auVar14._0_16_,uVar1);
      local_338 = 1.0 / auVar3._0_8_;
    }
    else {
      bVar4 = std::operator==(&CPD_type,"Table");
      if (bVar4) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::_Rb_tree(&local_1e8,&t0_deps->_M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::_Rb_tree(&local_218,&t1_deps->_M_t);
        local_338 = QueryTable(this,pxVar13,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&local_1e8,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&local_218);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::~_Rb_tree(&local_218);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::~_Rb_tree(&local_1e8);
        xmlXPathFreeObject(pxVar7);
      }
      else {
        bVar4 = std::operator==(&CPD_type,"Tree/ADD");
        if (!bVar4) {
          pEVar10 = (EParse *)__cxa_allocate_exception(0x28);
          std::operator+(&local_2f8,"CPD type \"",&CPD_type);
          std::operator+(&local_2d8,&local_2f8,"\" not supported.");
          EParse::EParse(pEVar10,&local_2d8);
          __cxa_throw(pEVar10,&EParse::typeinfo,E::~E);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::_Rb_tree(&local_248,&t0_deps->_M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::_Rb_tree(&local_278,&t1_deps->_M_t);
        local_338 = QueryADD(this,pxVar13,pxVar13,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                              *)&local_248,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                              *)&local_278);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::~_Rb_tree(&local_278);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::~_Rb_tree(&local_248);
        xmlXPathFreeObject(pxVar7);
      }
    }
    std::__cxx11::string::~string((string *)&CPD_type);
    std::__cxx11::stringstream::~stringstream((stringstream *)&xpath_ss);
    return local_338;
  }
  pEVar10 = (EParse *)__cxa_allocate_exception(0x28);
  std::operator+(&local_298,"Could not find CPD for variable ",var_name);
  EParse::EParse(pEVar10,&local_298);
  __cxa_throw(pEVar10,&EParse::typeinfo,E::~E);
}

Assistant:

double ParserProbModelXML::GetPotential(const std::string var_name,
                                        const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                        const std::map<std::string, std::pair<Index, Index> > t1_deps,
                                        const bool isUtility)
{
    stringstream xpath_ss;
    xmlXPathObjectPtr var_nodes;
    xpath_ss << "/ProbModelXML/ProbNet/Potentials/Potential";
    if(!isUtility)
    {
        xpath_ss << "[@role='conditionalProbability']/Variables/Variable[@timeSlice='1' and contains(@name, \"" 
                 << var_name << "\")]";
    }
    else
    {
        xpath_ss << "[@role='utility']/UtilityVariable[starts-with(@name, \"" 
                 << var_name << "\")]/following-sibling::Variables/Variable";
    }
    var_nodes = GetNodesMatchingExpression((xmlChar*) xpath_ss.str().c_str());
    if(var_nodes == NULL)
        throw EParse("Could not find CPD for variable " + var_name);

    xmlNodeSetPtr var_nodeset = var_nodes->nodesetval;
    xmlNodePtr top = var_nodeset->nodeTab[0];
    if(!isUtility)
    {
        bool cpd_found = false;
        for(int i = 0; !cpd_found && i < var_nodeset->nodeNr; i++)
        {
            top = var_nodeset->nodeTab[i];
            cpd_found = (top == xmlFirstElementChild(top->parent) &&
                         GetVariableName(top) == var_name); //this prevents possible partial matchings in the variable name
        }

        if(!cpd_found)
            throw EParse("Could not find CPD for variable " + var_name + "(empty potential)");
    }
    xmlNodePtr parent = top->parent->parent;
    string CPD_type = (char*) xmlGetProp(parent, (xmlChar*) "type"); //Potential
    if(CPD_type == "Uniform")
    {
        map<string, pair<Index, Index> >::const_iterator it = t1_deps.find(var_name);
        double p = 1.0/(it->second.second);
        if(DEBUG_PARSE)
        {
              cout << "Output: " << var_name << "=" << it->second.first << " | Input: Uniform | " << "p=" << p << endl;
        }
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else if(CPD_type == "Table")
    {
        double p = QueryTable(parent, t0_deps, t1_deps);
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else if(CPD_type == "Tree/ADD")
    {
        double p = QueryADD(parent, parent, t0_deps, t1_deps);
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else
    {
        throw EParse("CPD type \"" + CPD_type + "\" not supported.");
    }
}